

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O2

JDIMENSION jpeg_skip_scanlines(j_decompress_ptr cinfo,JDIMENSION num_lines)

{
  int *piVar1;
  int iVar2;
  jpeg_decomp_master *pjVar3;
  jpeg_d_main_controller *pjVar4;
  jpeg_d_coef_controller *pjVar5;
  jpeg_upsampler *pjVar6;
  jpeg_error_mgr *pjVar7;
  jpeg_d_main_controller *pjVar8;
  long lVar9;
  long lVar10;
  jpeg_entropy_decoder *pjVar11;
  jpeg_d_coef_controller *pjVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  JDIMENSION JVar22;
  long lVar23;
  jpeg_component_info *pjVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  uint local_8c;
  
  pjVar3 = cinfo->master;
  pjVar4 = cinfo->main;
  pjVar5 = cinfo->coef;
  pjVar6 = cinfo->upsample;
  if ((cinfo->quantize_colors != 0) && (cinfo->two_pass_quantize != 0)) {
    pjVar7 = cinfo->err;
    pjVar7->msg_code = 0x2f;
    (*pjVar7->error_exit)((j_common_ptr)cinfo);
  }
  iVar18 = cinfo->global_state;
  if (iVar18 != 0xcd) {
    pjVar7 = cinfo->err;
    pjVar7->msg_code = 0x14;
    (pjVar7->msg_parm).i[0] = iVar18;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar19 = cinfo->output_height;
  uVar20 = cinfo->output_scanline;
  if (uVar19 <= uVar20 + num_lines) {
    cinfo->output_scanline = uVar19;
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    cinfo->inputctl->eoi_reached = 1;
    return uVar19 - uVar20;
  }
  if (num_lines == 0) {
    return 0;
  }
  iVar18 = cinfo->max_v_samp_factor;
  iVar2 = cinfo->min_DCT_scaled_size;
  uVar25 = iVar18 * iVar2;
  uVar17 = (uVar25 - uVar20 % uVar25) % uVar25;
  local_8c = num_lines - uVar17;
  if (cinfo->upsample->need_context_rows == 0) {
    if (num_lines < uVar17) {
      increment_simple_rowgroup_ctr(cinfo,num_lines);
      return num_lines;
    }
    JVar22 = uVar17 + uVar20;
    cinfo->output_scanline = JVar22;
    pjVar4[6].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0;
    iVar2 = *(int *)((long)&pjVar3[1].prepare_for_output_pass + 4);
  }
  else {
    if (num_lines <= uVar17) {
LAB_0011c01c:
      read_and_discard_scanlines(cinfo,num_lines);
      return num_lines;
    }
    if (uVar17 < 2) {
      if (local_8c < uVar25 + 1 && *(int *)&pjVar4[6].start_pass != 0) goto LAB_0011c01c;
      if (*(int *)&pjVar4[6].start_pass == 0) goto LAB_0011c0d6;
      JVar22 = uVar20 + uVar17 + uVar25;
      cinfo->output_scanline = JVar22;
      local_8c = local_8c - uVar25;
    }
    else {
LAB_0011c0d6:
      JVar22 = uVar20 + uVar17;
      cinfo->output_scanline = JVar22;
    }
    iVar14 = *(int *)((long)&pjVar4[8].start_pass + 4);
    if ((iVar14 == 0) || (2 < uVar17 && iVar14 == 1)) {
      pjVar8 = cinfo->main;
      pjVar24 = cinfo->comp_info;
      uVar21 = 0;
      uVar16 = (ulong)(uint)cinfo->num_components;
      if (cinfo->num_components < 1) {
        uVar16 = uVar21;
      }
      for (; uVar21 != uVar16; uVar21 = uVar21 + 1) {
        uVar13 = (long)(pjVar24->DCT_scaled_size * pjVar24->v_samp_factor) / (long)iVar2;
        lVar9 = *(long *)(pjVar8[6].process_data + uVar21 * 8);
        lVar10 = *(long *)(pjVar8[7].start_pass + uVar21 * 8);
        iVar14 = (int)uVar13;
        lVar23 = (long)(iVar14 * (iVar2 + 2));
        uVar15 = 0;
        if (0 < iVar14) {
          uVar15 = uVar13 & 0xffffffff;
        }
        lVar27 = (long)(iVar14 * (iVar2 + 1));
        for (lVar28 = 0; uVar15 * 8 != lVar28; lVar28 = lVar28 + 8) {
          *(undefined8 *)(lVar9 + (long)iVar14 * -8 + lVar28) =
               *(undefined8 *)(lVar9 + lVar27 * 8 + lVar28);
          *(undefined8 *)(lVar10 + (long)iVar14 * -8 + lVar28) =
               *(undefined8 *)(lVar10 + lVar27 * 8 + lVar28);
          *(undefined8 *)(lVar9 + lVar23 * 8 + lVar28) = *(undefined8 *)(lVar9 + lVar28);
          *(undefined8 *)(lVar10 + lVar23 * 8 + lVar28) = *(undefined8 *)(lVar10 + lVar28);
        }
        pjVar24 = pjVar24 + 1;
      }
    }
    pjVar4[6].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0;
    *(undefined4 *)((long)&pjVar4[7].process_data + 4) = 0;
    iVar2 = *(int *)((long)&pjVar3[1].prepare_for_output_pass + 4);
  }
  if (iVar2 == 0) {
    pjVar6[7].need_context_rows = iVar18;
    *(uint *)&pjVar6[7].field_0x14 = uVar19 - JVar22;
  }
  iVar18 = cinfo->upsample->need_context_rows;
  uVar17 = (local_8c - 1) + (uint)(iVar18 == 0);
  uVar19 = 0;
  uVar20 = uVar17 - uVar17 % uVar25;
  if (cinfo->inputctl->has_multiple_scans == 0) {
    for (; uVar19 < uVar20; uVar19 = uVar19 + uVar25) {
      for (iVar18 = 0; iVar18 < *(int *)&pjVar5[1].consume_data; iVar18 = iVar18 + 1) {
        for (uVar26 = 0; uVar26 < cinfo->MCUs_per_row; uVar26 = uVar26 + 1) {
          pjVar11 = cinfo->entropy;
          if (pjVar11->insufficient_data == 0) {
            cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
          }
          (*pjVar11->decode_mcu)(cinfo,(JBLOCKROW *)0x0);
        }
      }
      uVar26 = cinfo->input_iMCU_row + 1;
      cinfo->input_iMCU_row = uVar26;
      cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
      if (uVar26 < cinfo->total_iMCU_rows) {
        pjVar12 = cinfo->coef;
        if (cinfo->comps_in_scan < 2) {
          if (uVar26 < cinfo->total_iMCU_rows - 1) {
            iVar18 = cinfo->cur_comp_info[0]->v_samp_factor;
          }
          else {
            iVar18 = cinfo->cur_comp_info[0]->last_row_height;
          }
          *(int *)&pjVar12[1].consume_data = iVar18;
        }
        else {
          *(undefined4 *)&pjVar12[1].consume_data = 1;
        }
        pjVar12[1].start_input_pass = (_func_void_j_decompress_ptr *)0x0;
      }
      else {
        (*cinfo->inputctl->finish_input_pass)(cinfo);
      }
    }
    cinfo->output_scanline = cinfo->output_scanline + uVar20;
    if (cinfo->upsample->need_context_rows != 0) {
      piVar1 = (int *)((long)&pjVar4[8].start_pass + 4);
      *piVar1 = *piVar1 + uVar17 / uVar25;
      goto LAB_0011c39d;
    }
  }
  else {
    cinfo->output_iMCU_row = cinfo->output_iMCU_row + uVar17 / uVar25;
    cinfo->output_scanline = JVar22 + uVar20;
    if (iVar18 != 0) {
      piVar1 = (int *)((long)&pjVar4[8].start_pass + 4);
      *piVar1 = *piVar1 + uVar17 / uVar25;
LAB_0011c39d:
      read_and_discard_scanlines(cinfo,local_8c - uVar20);
      goto LAB_0011c3b7;
    }
  }
  increment_simple_rowgroup_ctr(cinfo,local_8c - uVar20);
LAB_0011c3b7:
  if (*(int *)((long)&pjVar3[1].prepare_for_output_pass + 4) == 0) {
    *(JDIMENSION *)&pjVar6[7].field_0x14 = cinfo->output_height - cinfo->output_scanline;
  }
  return num_lines;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_skip_scanlines(j_decompress_ptr cinfo, JDIMENSION num_lines)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  my_master_ptr master = (my_master_ptr)cinfo->master;
  my_upsample_ptr upsample = (my_upsample_ptr)cinfo->upsample;
  JDIMENSION i, x;
  int y;
  JDIMENSION lines_per_iMCU_row, lines_left_in_iMCU_row, lines_after_iMCU_row;
  JDIMENSION lines_to_skip, lines_to_read;

  /* Two-pass color quantization is not supported. */
  if (cinfo->quantize_colors && cinfo->two_pass_quantize)
    ERREXIT(cinfo, JERR_NOTIMPL);

  if (cinfo->global_state != DSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Do not skip past the bottom of the image. */
  if (cinfo->output_scanline + num_lines >= cinfo->output_height) {
    num_lines = cinfo->output_height - cinfo->output_scanline;
    cinfo->output_scanline = cinfo->output_height;
    (*cinfo->inputctl->finish_input_pass) (cinfo);
    cinfo->inputctl->eoi_reached = TRUE;
    return num_lines;
  }

  if (num_lines == 0)
    return 0;

  lines_per_iMCU_row = cinfo->_min_DCT_scaled_size * cinfo->max_v_samp_factor;
  lines_left_in_iMCU_row =
    (lines_per_iMCU_row - (cinfo->output_scanline % lines_per_iMCU_row)) %
    lines_per_iMCU_row;
  lines_after_iMCU_row = num_lines - lines_left_in_iMCU_row;

  /* Skip the lines remaining in the current iMCU row.  When upsampling
   * requires context rows, we need the previous and next rows in order to read
   * the current row.  This adds some complexity.
   */
  if (cinfo->upsample->need_context_rows) {
    /* If the skipped lines would not move us past the current iMCU row, we
     * read the lines and ignore them.  There might be a faster way of doing
     * this, but we are facing increasing complexity for diminishing returns.
     * The increasing complexity would be a by-product of meddling with the
     * state machine used to skip context rows.  Near the end of an iMCU row,
     * the next iMCU row may have already been entropy-decoded.  In this unique
     * case, we will read the next iMCU row if we cannot skip past it as well.
     */
    if ((num_lines < lines_left_in_iMCU_row + 1) ||
        (lines_left_in_iMCU_row <= 1 && main_ptr->buffer_full &&
         lines_after_iMCU_row < lines_per_iMCU_row + 1)) {
      read_and_discard_scanlines(cinfo, num_lines);
      return num_lines;
    }

    /* If the next iMCU row has already been entropy-decoded, make sure that
     * we do not skip too far.
     */
    if (lines_left_in_iMCU_row <= 1 && main_ptr->buffer_full) {
      cinfo->output_scanline += lines_left_in_iMCU_row + lines_per_iMCU_row;
      lines_after_iMCU_row -= lines_per_iMCU_row;
    } else {
      cinfo->output_scanline += lines_left_in_iMCU_row;
    }

    /* If we have just completed the first block, adjust the buffer pointers */
    if (main_ptr->iMCU_row_ctr == 0 ||
        (main_ptr->iMCU_row_ctr == 1 && lines_left_in_iMCU_row > 2))
      set_wraparound_pointers(cinfo);
    main_ptr->buffer_full = FALSE;
    main_ptr->rowgroup_ctr = 0;
    main_ptr->context_state = CTX_PREPARE_FOR_IMCU;
    if (!master->using_merged_upsample) {
      upsample->next_row_out = cinfo->max_v_samp_factor;
      upsample->rows_to_go = cinfo->output_height - cinfo->output_scanline;
    }
  }

  /* Skipping is much simpler when context rows are not required. */
  else {
    if (num_lines < lines_left_in_iMCU_row) {
      increment_simple_rowgroup_ctr(cinfo, num_lines);
      return num_lines;
    } else {
      cinfo->output_scanline += lines_left_in_iMCU_row;
      main_ptr->buffer_full = FALSE;
      main_ptr->rowgroup_ctr = 0;
      if (!master->using_merged_upsample) {
        upsample->next_row_out = cinfo->max_v_samp_factor;
        upsample->rows_to_go = cinfo->output_height - cinfo->output_scanline;
      }
    }
  }

  /* Calculate how many full iMCU rows we can skip. */
  if (cinfo->upsample->need_context_rows)
    lines_to_skip = ((lines_after_iMCU_row - 1) / lines_per_iMCU_row) *
                    lines_per_iMCU_row;
  else
    lines_to_skip = (lines_after_iMCU_row / lines_per_iMCU_row) *
                    lines_per_iMCU_row;
  /* Calculate the number of lines that remain to be skipped after skipping all
   * of the full iMCU rows that we can.  We will not read these lines unless we
   * have to.
   */
  lines_to_read = lines_after_iMCU_row - lines_to_skip;

  /* For images requiring multiple scans (progressive, non-interleaved, etc.),
   * all of the entropy decoding occurs in jpeg_start_decompress(), assuming
   * that the input data source is non-suspending.  This makes skipping easy.
   */
  if (cinfo->inputctl->has_multiple_scans) {
    if (cinfo->upsample->need_context_rows) {
      cinfo->output_scanline += lines_to_skip;
      cinfo->output_iMCU_row += lines_to_skip / lines_per_iMCU_row;
      main_ptr->iMCU_row_ctr += lines_to_skip / lines_per_iMCU_row;
      /* It is complex to properly move to the middle of a context block, so
       * read the remaining lines instead of skipping them.
       */
      read_and_discard_scanlines(cinfo, lines_to_read);
    } else {
      cinfo->output_scanline += lines_to_skip;
      cinfo->output_iMCU_row += lines_to_skip / lines_per_iMCU_row;
      increment_simple_rowgroup_ctr(cinfo, lines_to_read);
    }
    if (!master->using_merged_upsample)
      upsample->rows_to_go = cinfo->output_height - cinfo->output_scanline;
    return num_lines;
  }

  /* Skip the iMCU rows that we can safely skip. */
  for (i = 0; i < lines_to_skip; i += lines_per_iMCU_row) {
    for (y = 0; y < coef->MCU_rows_per_iMCU_row; y++) {
      for (x = 0; x < cinfo->MCUs_per_row; x++) {
        /* Calling decode_mcu() with a NULL pointer causes it to discard the
         * decoded coefficients.  This is ~5% faster for large subsets, but
         * it's tough to tell a difference for smaller images.
         */
        if (!cinfo->entropy->insufficient_data)
          cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
        (*cinfo->entropy->decode_mcu) (cinfo, NULL);
      }
    }
    cinfo->input_iMCU_row++;
    cinfo->output_iMCU_row++;
    if (cinfo->input_iMCU_row < cinfo->total_iMCU_rows)
      start_iMCU_row(cinfo);
    else
      (*cinfo->inputctl->finish_input_pass) (cinfo);
  }
  cinfo->output_scanline += lines_to_skip;

  if (cinfo->upsample->need_context_rows) {
    /* Context-based upsampling keeps track of iMCU rows. */
    main_ptr->iMCU_row_ctr += lines_to_skip / lines_per_iMCU_row;

    /* It is complex to properly move to the middle of a context block, so
     * read the remaining lines instead of skipping them.
     */
    read_and_discard_scanlines(cinfo, lines_to_read);
  } else {
    increment_simple_rowgroup_ctr(cinfo, lines_to_read);
  }

  /* Since skipping lines involves skipping the upsampling step, the value of
   * "rows_to_go" will become invalid unless we set it here.  NOTE: This is a
   * bit odd, since "rows_to_go" seems to be redundantly keeping track of
   * output_scanline.
   */
  if (!master->using_merged_upsample)
    upsample->rows_to_go = cinfo->output_height - cinfo->output_scanline;

  /* Always skip the requested number of lines. */
  return num_lines;
}